

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O1

int nghttp2_submit_window_update
              (nghttp2_session *session,uint8_t flags,int32_t stream_id,
              int32_t window_size_increment)

{
  int iVar1;
  nghttp2_stream *pnVar2;
  int32_t *piVar3;
  int iVar4;
  int32_t local_24;
  
  iVar4 = 0;
  if (window_size_increment != 0) {
    if (stream_id == 0) {
      iVar1 = nghttp2_adjust_local_window_size
                        (&session->local_window_size,&session->recv_window_size,
                         &session->recv_reduction,&local_24);
      if (iVar1 != 0) {
        return iVar1;
      }
      pnVar2 = (nghttp2_stream *)0x0;
    }
    else {
      pnVar2 = nghttp2_session_get_stream(session,stream_id);
      if (pnVar2 == (nghttp2_stream *)0x0) {
        return 0;
      }
      iVar1 = nghttp2_adjust_local_window_size
                        (&pnVar2->local_window_size,&pnVar2->recv_window_size,
                         &pnVar2->recv_reduction,&local_24);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    if (0 < window_size_increment) {
      piVar3 = &session->consumed_size;
      if (stream_id != 0) {
        piVar3 = &pnVar2->consumed_size;
      }
      iVar4 = *piVar3 - window_size_increment;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      *piVar3 = iVar4;
      iVar4 = nghttp2_session_add_window_update(session,'\0',stream_id,window_size_increment);
    }
  }
  return iVar4;
}

Assistant:

int nghttp2_submit_window_update(nghttp2_session *session, uint8_t flags,
                                 int32_t stream_id,
                                 int32_t window_size_increment) {
  int rv;
  nghttp2_stream *stream = 0;
  (void)flags;

  if (window_size_increment == 0) {
    return 0;
  }
  if (stream_id == 0) {
    rv = nghttp2_adjust_local_window_size(
        &session->local_window_size, &session->recv_window_size,
        &session->recv_reduction, &window_size_increment);
    if (rv != 0) {
      return rv;
    }
  } else {
    stream = nghttp2_session_get_stream(session, stream_id);
    if (!stream) {
      return 0;
    }

    rv = nghttp2_adjust_local_window_size(
        &stream->local_window_size, &stream->recv_window_size,
        &stream->recv_reduction, &window_size_increment);
    if (rv != 0) {
      return rv;
    }
  }

  if (window_size_increment > 0) {
    if (stream_id == 0) {
      session->consumed_size =
          nghttp2_max(0, session->consumed_size - window_size_increment);
    } else {
      stream->consumed_size =
          nghttp2_max(0, stream->consumed_size - window_size_increment);
    }

    return nghttp2_session_add_window_update(session, 0, stream_id,
                                             window_size_increment);
  }
  return 0;
}